

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reorg.cpp
# Opt level: O3

int __thiscall ncnn::Reorg::forward(Reorg *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  size_t sVar5;
  void *pvVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  int iVar10;
  ulong uVar11;
  ulong uVar12;
  uint _h;
  uint uVar13;
  ulong uVar14;
  undefined4 *puVar15;
  undefined4 *puVar16;
  undefined4 *puVar17;
  undefined4 *puVar18;
  undefined4 *puVar19;
  ulong uVar20;
  int _w;
  ulong local_80;
  undefined4 *local_70;
  
  uVar1 = bottom_blob->c;
  iVar10 = this->stride;
  uVar9 = (long)bottom_blob->w / (long)iVar10;
  _h = bottom_blob->h / iVar10;
  _w = (int)uVar9;
  Mat::create(top_blob,_w,_h,uVar1 * iVar10 * iVar10,bottom_blob->elemsize,opt->blob_allocator);
  iVar10 = -100;
  if ((top_blob->data != (void *)0x0) && ((long)top_blob->c * top_blob->cstep != 0)) {
    if (0 < (int)uVar1) {
      iVar10 = bottom_blob->w;
      local_70 = (undefined4 *)bottom_blob->data;
      sVar4 = bottom_blob->cstep;
      sVar5 = bottom_blob->elemsize;
      uVar2 = this->stride;
      local_80 = 0;
      do {
        if (0 < (int)uVar2) {
          pvVar6 = top_blob->data;
          sVar7 = top_blob->cstep;
          sVar8 = top_blob->elemsize;
          uVar12 = 0;
          puVar18 = local_70;
          do {
            iVar3 = this->stride;
            uVar20 = 0;
            puVar19 = puVar18;
            do {
              if (0 < (int)_h) {
                puVar16 = (undefined4 *)
                          ((uVar20 + (long)(int)((uVar2 * (int)local_80 + (int)uVar12) * uVar2)) *
                           sVar7 * sVar8 + (long)pvVar6);
                uVar11 = 0;
                puVar15 = puVar19;
                do {
                  uVar14 = uVar9 & 0xffffffff;
                  puVar17 = puVar15;
                  if (0 < _w) {
                    do {
                      *puVar16 = *puVar17;
                      puVar16 = puVar16 + 1;
                      puVar17 = puVar17 + iVar3;
                      uVar13 = (int)uVar14 - 1;
                      uVar14 = (ulong)uVar13;
                    } while (uVar13 != 0);
                  }
                  uVar11 = uVar11 + 1;
                  puVar15 = (undefined4 *)((long)puVar15 + (long)iVar10 * 4 * (long)iVar3);
                } while (uVar11 != _h);
              }
              uVar20 = uVar20 + 1;
              puVar19 = puVar19 + 1;
            } while (uVar20 != uVar2);
            uVar12 = uVar12 + 1;
            puVar18 = puVar18 + iVar10;
          } while (uVar12 != uVar2);
        }
        local_80 = local_80 + 1;
        local_70 = (undefined4 *)((long)local_70 + sVar4 * sVar5);
      } while (local_80 != uVar1);
    }
    iVar10 = 0;
  }
  return iVar10;
}

Assistant:

int Reorg::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;

    int outw = w / stride;
    int outh = h / stride;
    int outc = channels * stride * stride;

    top_blob.create(outw, outh, outc, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const Mat m = bottom_blob.channel(q);

        for (int sh = 0; sh < stride; sh++)
        {
            for (int sw = 0; sw < stride; sw++)
            {
                float* outptr = top_blob.channel(q*stride*stride + sh*stride + sw);

                for (int i = 0; i < outh; i++)
                {
                    const float* sptr = m.row(i*stride + sh) + sw;
                    for (int j = 0; j < outw; j++)
                    {
                        outptr[0] = sptr[0];

                        sptr += stride;
                        outptr++;
                    }
                }
            }
        }
    }

    return 0;
}